

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int seekAndWrite(unixFile *id,unqlite_int64 offset,void *pBuf,unqlite_int64 cnt)

{
  __off_t _Var1;
  int *piVar2;
  ssize_t sVar3;
  unqlite_int64 newOffset;
  int got;
  unqlite_int64 cnt_local;
  void *pBuf_local;
  unqlite_int64 offset_local;
  unixFile *id_local;
  
  _Var1 = lseek(id->h,offset,0);
  if (_Var1 == offset) {
    sVar3 = write(id->h,pBuf,cnt);
    id_local._4_4_ = (int)sVar3;
    if (id_local._4_4_ < 0) {
      piVar2 = __errno_location();
      id->lastErrno = *piVar2;
    }
  }
  else {
    if (_Var1 == -1) {
      piVar2 = __errno_location();
      id->lastErrno = *piVar2;
    }
    else {
      id->lastErrno = 0;
    }
    id_local._4_4_ = -1;
  }
  return id_local._4_4_;
}

Assistant:

static int seekAndWrite(unixFile *id, unqlite_int64 offset, const void *pBuf, unqlite_int64 cnt){
  int got;
#if (!defined(USE_PREAD) && !defined(USE_PREAD64))
  unqlite_int64 newOffset;
#endif
  
#if defined(USE_PREAD)
  got = pwrite(id->h, pBuf, cnt, offset);
#elif defined(USE_PREAD64)
  got = pwrite64(id->h, pBuf, cnt, offset);
#else
  newOffset = lseek(id->h, offset, SEEK_SET);
  if( newOffset!=offset ){
    if( newOffset == -1 ){
      ((unixFile*)id)->lastErrno = errno;
    }else{
      ((unixFile*)id)->lastErrno = 0;			
    }
    return -1;
  }
  got = write(id->h, pBuf, cnt);
#endif
  if( got<0 ){
    ((unixFile*)id)->lastErrno = errno;
  }
  return got;
}